

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O1

void __thiscall
vkt::synchronization::anon_unknown_0::CopyBlitImage::BlitImplementation::~BlitImplementation
          (BlitImplementation *this)

{
  (this->super_ImplementationBase).super_Operation._vptr_Operation =
       (_func_int **)&PTR__ImplementationBase_00d660f8;
  de::details::
  UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>::reset
            (&(this->super_ImplementationBase).m_image.
              super_UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
            );
  de::details::
  UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::reset
            (&(this->super_ImplementationBase).m_hostBuffer.
              super_UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
            );
  operator_delete(this,0x98);
  return;
}

Assistant:

BlitImplementation (OperationContext& context, Resource& resource, const AccessMode mode)
		: ImplementationBase	(context, resource, mode)
		, m_blitRegion			(makeBlitRegion(m_resource))
	{
		const InstanceInterface&	vki				= m_context.getInstanceInterface();
		const VkPhysicalDevice		physDevice		= m_context.getPhysicalDevice();
		const VkFormatProperties	formatProps		= getPhysicalDeviceFormatProperties(vki, physDevice, m_resource.getImage().format);
		const VkFormatFeatureFlags	requiredFlags	= (VK_FORMAT_FEATURE_BLIT_SRC_BIT | VK_FORMAT_FEATURE_BLIT_DST_BIT);

		// SRC and DST blit is required because both images are using the same format.
		if ((formatProps.optimalTilingFeatures & requiredFlags) != requiredFlags)
			TCU_THROW(NotSupportedError, "Format doesn't support blits");
	}